

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compatibility.cpp
# Opt level: O0

void SetCompatibilityParams(void)

{
  int iVar1;
  int iVar2;
  DWORD DVar3;
  side_t *this;
  sector_t_conflict *psVar4;
  line_t_conflict *plVar5;
  uint uVar6;
  uint uVar7;
  int *piVar8;
  uint32_t *puVar9;
  uint *puVar10;
  DWORD *pDVar11;
  FMapThing *pFVar12;
  bool bVar13;
  side_t *side;
  int index;
  double delta;
  sector_t_conflict *sec;
  line_t_conflict *line_4;
  line_t_conflict *line_3;
  int ii;
  line_t_conflict *line_2;
  line_t_conflict *line_1;
  line_t_conflict *line;
  uint i;
  
  if (ii_compatparams != -1) {
    line._4_4_ = ii_compatparams;
    while( true ) {
      uVar6 = TArray<int,_int>::Size(&CompatParams);
      bVar13 = false;
      if (line._4_4_ < uVar6) {
        piVar8 = TArray<int,_int>::operator[](&CompatParams,(ulong)line._4_4_);
        bVar13 = *piVar8 != 0;
      }
      if (!bVar13) break;
      piVar8 = TArray<int,_int>::operator[](&CompatParams,(ulong)line._4_4_);
      switch(*piVar8) {
      case 1:
        piVar8 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 1));
        plVar5 = lines;
        if (*piVar8 < numlines) {
          piVar8 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 1));
          iVar2 = *piVar8;
          puVar10 = (uint *)TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 2));
          plVar5[iVar2].flags = (*puVar10 ^ 0xffffffff) & plVar5[iVar2].flags;
        }
        line._4_4_ = line._4_4_ + 3;
        break;
      case 2:
        piVar8 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 1));
        plVar5 = lines;
        if (*piVar8 < numlines) {
          piVar8 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 1));
          iVar2 = *piVar8;
          puVar10 = (uint *)TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 2));
          plVar5[iVar2].flags = *puVar10 | plVar5[iVar2].flags;
        }
        line._4_4_ = line._4_4_ + 3;
        break;
      case 3:
        piVar8 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 1));
        plVar5 = lines;
        if (*piVar8 < numlines) {
          piVar8 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 1));
          iVar2 = *piVar8;
          piVar8 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 2));
          plVar5[iVar2].special = *piVar8;
          for (line_3._4_4_ = 0; line_3._4_4_ < 5; line_3._4_4_ = line_3._4_4_ + 1) {
            piVar8 = TArray<int,_int>::operator[]
                               (&CompatParams,(ulong)(line._4_4_ + line_3._4_4_ + 3));
            plVar5[iVar2].args[line_3._4_4_] = *piVar8;
          }
        }
        line._4_4_ = line._4_4_ + 8;
        break;
      case 4:
        piVar8 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 1));
        plVar5 = lines;
        if (*piVar8 < numlines) {
          piVar8 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 1));
          iVar2 = *piVar8;
          plVar5[iVar2].special = 0;
          memset(plVar5[iVar2].args,0,0x14);
        }
        line._4_4_ = line._4_4_ + 2;
        break;
      case 5:
        piVar8 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 1));
        plVar5 = lines;
        if (*piVar8 < numlines) {
          piVar8 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 1));
          iVar2 = *piVar8;
          puVar9 = (uint32_t *)TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 2));
          plVar5[iVar2].activation = *puVar9;
        }
        line._4_4_ = line._4_4_ + 3;
        break;
      case 6:
        piVar8 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 1));
        psVar4 = sectors;
        if (*piVar8 < numsectors) {
          piVar8 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 1));
          iVar2 = *piVar8;
          piVar8 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 2));
          iVar1 = *piVar8;
          secplane_t::ChangeHeight(&psVar4[iVar2].floorplane,(double)iVar1 / 65536.0);
          sector_t::ChangePlaneTexZ((sector_t *)(psVar4 + iVar2),0,(double)iVar1 / 65536.0);
        }
        line._4_4_ = line._4_4_ + 3;
        break;
      case 7:
        piVar8 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 1));
        iVar2 = *piVar8;
        if (iVar2 < numsectors) {
          piVar8 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 2));
          sectors[iVar2].special = (short)*piVar8;
        }
        line._4_4_ = line._4_4_ + 3;
        break;
      case 8:
        piVar8 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 1));
        plVar5 = lines;
        if (*piVar8 < numlines) {
          piVar8 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 1));
          iVar2 = *piVar8;
          piVar8 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 2));
          this = plVar5[iVar2].sidedef[*piVar8];
          if (this != (side_t *)0x0) {
            piVar8 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 3));
            iVar2 = *piVar8;
            piVar8 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 4));
            side_t::SetTextureYScale(this,iVar2,(double)*piVar8 / 65536.0);
          }
        }
        line._4_4_ = line._4_4_ + 5;
        break;
      case 9:
        puVar10 = (uint *)TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 1));
        uVar6 = *puVar10;
        uVar7 = TArray<FMapThing,_FMapThing>::Size(&MapThingsConverted);
        if (uVar6 < uVar7) {
          piVar8 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 2));
          iVar2 = *piVar8;
          piVar8 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 1));
          pFVar12 = TArray<FMapThing,_FMapThing>::operator[](&MapThingsConverted,(long)*piVar8);
          (pFVar12->pos).Z = (double)iVar2 / 256.0;
        }
        line._4_4_ = line._4_4_ + 3;
        break;
      case 10:
        puVar10 = (uint *)TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 1));
        if (*puVar10 < (uint)numsectors) {
          piVar8 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 2));
          if (*piVar8 == 0) {
            piVar8 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 1));
            FTagManager::RemoveSectorTags(&tagManager,*piVar8);
          }
          else {
            piVar8 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 1));
            iVar2 = *piVar8;
            piVar8 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 2));
            FTagManager::AddSectorTag(&tagManager,iVar2,*piVar8);
          }
        }
        line._4_4_ = line._4_4_ + 3;
        break;
      case 0xb:
        puVar10 = (uint *)TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 1));
        uVar6 = *puVar10;
        uVar7 = TArray<FMapThing,_FMapThing>::Size(&MapThingsConverted);
        if (uVar6 < uVar7) {
          pDVar11 = (DWORD *)TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 2));
          DVar3 = *pDVar11;
          piVar8 = TArray<int,_int>::operator[](&CompatParams,(ulong)(line._4_4_ + 1));
          pFVar12 = TArray<FMapThing,_FMapThing>::operator[](&MapThingsConverted,(long)*piVar8);
          pFVar12->flags = DVar3;
        }
        line._4_4_ = line._4_4_ + 3;
      }
    }
  }
  return;
}

Assistant:

void SetCompatibilityParams()
{
	if (ii_compatparams != -1)
	{
		unsigned i = ii_compatparams;

		while (i < CompatParams.Size() && CompatParams[i] != CP_END)
		{
			switch (CompatParams[i])
			{
				case CP_CLEARFLAGS:
				{
					if (CompatParams[i+1] < numlines)
					{
						line_t *line = &lines[CompatParams[i+1]];
						line->flags &= ~CompatParams[i+2];
					}
					i+=3;
					break;
				}
				case CP_SETFLAGS:
				{
					if (CompatParams[i+1] < numlines)
					{
						line_t *line = &lines[CompatParams[i+1]];
						line->flags |= CompatParams[i+2];
					}
					i+=3;
					break;
				}
				case CP_SETSPECIAL:
				{
					if (CompatParams[i+1] < numlines)
					{
						line_t *line = &lines[CompatParams[i+1]];
						line->special = CompatParams[i+2];
						for(int ii=0;ii<5;ii++)
						{
							line->args[ii] = CompatParams[i+ii+3];
						}
					}
					i+=8;
					break;
				}
				case CP_CLEARSPECIAL:
				{
					if (CompatParams[i+1] < numlines)
					{
						line_t *line = &lines[CompatParams[i+1]];
						line->special = 0;
						memset(line->args, 0, sizeof(line->args));
					}
					i += 2;
					break;
				}
				case CP_SETACTIVATION:
				{
					if (CompatParams[i+1] < numlines)
					{
						line_t *line = &lines[CompatParams[i+1]];
						line->activation = CompatParams[i+2];
					}
					i += 3;
					break;
				}
				case CP_SECTORFLOOROFFSET:
				{
					if (CompatParams[i+1] < numsectors)
					{
						sector_t *sec = &sectors[CompatParams[i+1]];
						const double delta = CompatParams[i + 2] / 65536.0;
						sec->floorplane.ChangeHeight(delta);
						sec->ChangePlaneTexZ(sector_t::floor, delta);
					}
					i += 3;
					break;
				}
				case CP_SETSECTORSPECIAL:
				{
					const int index = CompatParams[i + 1];
					if (index < numsectors)
					{
						sectors[index].special = CompatParams[i + 2];
					}
					i += 3;
					break;
				}
				case CP_SETWALLYSCALE:
				{
					if (CompatParams[i+1] < numlines)
					{
						side_t *side = lines[CompatParams[i+1]].sidedef[CompatParams[i+2]];
						if (side != NULL)
						{
							side->SetTextureYScale(CompatParams[i+3], CompatParams[i+4] / 65536.);
						}
					}
					i += 5;
					break;
				}
				case CP_SETTHINGZ:
				{
					// When this is called, the things haven't been spawned yet so we can alter the position inside the MapThings array.
					if ((unsigned)CompatParams[i+1] < MapThingsConverted.Size())
					{
						MapThingsConverted[CompatParams[i+1]].pos.Z = CompatParams[i+2]/256.;
					}
					i += 3;
					break;
				}	
				case CP_SETTAG:
				{
					if ((unsigned)CompatParams[i + 1] < (unsigned)numsectors)
					{
						// this assumes that the sector does not have any tags yet!
						if (CompatParams[i + 2] == 0)
						{
							tagManager.RemoveSectorTags(CompatParams[i + 1]);
						}
						else
						{
							tagManager.AddSectorTag(CompatParams[i + 1], CompatParams[i + 2]);
						}
					}
					i += 3;
					break;
				}
				case CP_SETTHINGFLAGS:
				{
					if ((unsigned)CompatParams[i + 1] < MapThingsConverted.Size())
					{
						MapThingsConverted[CompatParams[i + 1]].flags = CompatParams[i + 2];
					}
					i += 3;
					break;
				}
			}
		}
	}
}